

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::CloseCurrentPopup(void)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  ImGuiPopupRef *pIVar4;
  ImGuiWindow *pIVar5;
  uint uVar6;
  int remaining;
  
  uVar6 = (GImGui->CurrentPopupStack).Size;
  if (0 < (int)uVar6) {
    iVar1 = uVar6 - 1;
    iVar3 = (GImGui->OpenPopupStack).Size;
    if (iVar1 <= iVar3) {
      if (iVar3 < (int)uVar6) {
LAB_0013695b:
        __assert_fail("i < Size",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/lib/imgui.h"
                      ,0x353,
                      "value_type &ImVector<ImGuiPopupRef>::operator[](int) [T = ImGuiPopupRef]");
      }
      pIVar4 = (GImGui->OpenPopupStack).Data;
      if ((GImGui->CurrentPopupStack).Data[iVar1].PopupId == pIVar4[iVar1].PopupId) {
        remaining = iVar1;
        if (uVar6 != 1) {
          do {
            if (iVar3 <= iVar1) goto LAB_0013695b;
            uVar2 = uVar6 - 1;
            pIVar5 = pIVar4[uVar2].Window;
            if (pIVar5 == (ImGuiWindow *)0x0) {
              remaining = uVar6 - 1;
              goto LAB_00136958;
            }
            if ((pIVar5->Flags & 0x8000000) == 0) goto LAB_00136958;
            uVar6 = uVar2;
            remaining = remaining + -1;
          } while (1 < (int)uVar2);
          remaining = 0;
        }
LAB_00136958:
        ClosePopupToLevel(remaining);
        return;
      }
    }
  }
  return;
}

Assistant:

void ImGui::CloseCurrentPopup()
{
    ImGuiContext& g = *GImGui;
    int popup_idx = g.CurrentPopupStack.Size - 1;
    if (popup_idx < 0 || popup_idx > g.OpenPopupStack.Size || g.CurrentPopupStack[popup_idx].PopupId != g.OpenPopupStack[popup_idx].PopupId)
        return;
    while (popup_idx > 0 && g.OpenPopupStack[popup_idx].Window && (g.OpenPopupStack[popup_idx].Window->Flags & ImGuiWindowFlags_ChildMenu))
        popup_idx--;
    ClosePopupToLevel(popup_idx);
}